

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTarget.cpp
# Opt level: O3

void __thiscall
sf::RenderTarget::setupDraw(RenderTarget *this,bool useVertexCache,RenderStates *states)

{
  Texture *pTVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  PFNGLENABLEPROC *pp_Var5;
  Uint64 UVar6;
  socklen_t extraout_EDX;
  socklen_t extraout_EDX_00;
  socklen_t extraout_EDX_01;
  socklen_t extraout_EDX_02;
  socklen_t extraout_EDX_03;
  socklen_t extraout_EDX_04;
  socklen_t __len;
  RenderStates *right;
  RenderTarget *this_00;
  
  this_00 = this;
  if ((this->m_cache).enable == false) {
    iVar4 = (*this->_vptr_RenderTarget[3])(this);
    if ((char)iVar4 == '\0') {
      pp_Var5 = &sf_glad_glDisable;
    }
    else {
      pp_Var5 = &sf_glad_glEnable;
    }
    this_00 = (RenderTarget *)0x8db9;
    (**pp_Var5)(0x8db9);
  }
  if ((this->m_cache).glStatesSet == false) {
    this_00 = this;
    resetGLStates(this);
  }
  if (useVertexCache) {
    if (((this->m_cache).enable != true) || ((this->m_cache).useVertexCache == false)) {
      (*sf_glad_glLoadIdentity)();
    }
  }
  else {
    applyTransform(this_00,&states->transform);
  }
  if (((this->m_cache).enable != true) || (bVar2 = 1, (this->m_cache).viewChanged == true)) {
    applyCurrentView(this);
    bVar2 = (this->m_cache).enable;
  }
  if ((bVar2 & 1) == 0) {
LAB_001723c0:
    right = states;
    applyBlendMode(this,&states->blendMode);
    __len = extraout_EDX_00;
  }
  else {
    right = (RenderStates *)&(this->m_cache).lastBlendMode;
    bVar3 = operator!=(&states->blendMode,(BlendMode *)right);
    __len = extraout_EDX;
    if (bVar3) goto LAB_001723c0;
  }
  pTVar1 = states->texture;
  iVar4 = (int)pTVar1;
  if ((this->m_cache).enable == true) {
    if (pTVar1 == (Texture *)0x0) {
      if ((this->m_cache).lastTextureId == 0) goto LAB_00172461;
      UVar6 = 0;
      right = (RenderStates *)0x1;
      Texture::bind(0,(sockaddr *)0x1,__len);
      __len = extraout_EDX_03;
    }
    else {
      if (pTVar1->m_fboAttachment == true) {
        right = (RenderStates *)0x1;
        Texture::bind(iVar4,(sockaddr *)0x1,__len);
        __len = extraout_EDX_01;
        goto LAB_00172406;
      }
      if (pTVar1->m_cacheId == (this->m_cache).lastTextureId) goto LAB_00172461;
      right = (RenderStates *)0x1;
      Texture::bind(iVar4,(sockaddr *)0x1,__len);
      UVar6 = pTVar1->m_cacheId;
      __len = extraout_EDX_04;
    }
    (this->m_cache).lastTextureId = UVar6;
  }
  else {
    right = (RenderStates *)0x1;
    Texture::bind(iVar4,(sockaddr *)0x1,__len);
    __len = extraout_EDX_02;
    if (pTVar1 == (Texture *)0x0) {
      UVar6 = 0;
    }
    else {
LAB_00172406:
      UVar6 = pTVar1->m_cacheId;
    }
    (this->m_cache).lastTextureId = UVar6;
  }
LAB_00172461:
  if (states->shader != (Shader *)0x0) {
    Shader::bind((int)states->shader,(sockaddr *)right,__len);
    return;
  }
  return;
}

Assistant:

void RenderTarget::setupDraw(bool useVertexCache, const RenderStates& states)
{
    // Enable or disable sRGB encoding
    // This is needed for drivers that do not check the format of the surface drawn to before applying sRGB conversion
    if (!m_cache.enable)
    {
        if (isSrgb())
            glCheck(glEnable(GL_FRAMEBUFFER_SRGB));
        else
            glCheck(glDisable(GL_FRAMEBUFFER_SRGB));
    }

    // First set the persistent OpenGL states if it's the very first call
    if (!m_cache.glStatesSet)
        resetGLStates();

    if (useVertexCache)
    {
        // Since vertices are transformed, we must use an identity transform to render them
        if (!m_cache.enable || !m_cache.useVertexCache)
            glCheck(glLoadIdentity());
    }
    else
    {
        applyTransform(states.transform);
    }

    // Apply the view
    if (!m_cache.enable || m_cache.viewChanged)
        applyCurrentView();

    // Apply the blend mode
    if (!m_cache.enable || (states.blendMode != m_cache.lastBlendMode))
        applyBlendMode(states.blendMode);

    // Apply the texture
    if (!m_cache.enable || (states.texture && states.texture->m_fboAttachment))
    {
        // If the texture is an FBO attachment, always rebind it
        // in order to inform the OpenGL driver that we want changes
        // made to it in other contexts to be visible here as well
        // This saves us from having to call glFlush() in
        // RenderTextureImplFBO which can be quite costly
        // See: https://www.khronos.org/opengl/wiki/Memory_Model
        applyTexture(states.texture);
    }
    else
    {
        Uint64 textureId = states.texture ? states.texture->m_cacheId : 0;
        if (textureId != m_cache.lastTextureId)
            applyTexture(states.texture);
    }

    // Apply the shader
    if (states.shader)
        applyShader(states.shader);
}